

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_xref.cc
# Opt level: O1

int OBJ_find_sigid_algs(int signid,int *pdig_nid,int *ppkey_nid)

{
  nid_triple *pnVar1;
  nid_triple *pnVar2;
  ulong uVar3;
  nid_triple *pnVar4;
  bool bVar5;
  
  if (signid == 0x18c) {
    pnVar2 = kTriples;
    bVar5 = true;
  }
  else {
    uVar3 = 0xffffffffffffffff;
    pnVar4 = kTriples;
    do {
      if (uVar3 == 0x10) {
        bVar5 = false;
        goto LAB_00242e22;
      }
      pnVar2 = pnVar4 + 1;
      uVar3 = uVar3 + 1;
      pnVar1 = pnVar4 + 1;
      pnVar4 = pnVar2;
    } while (pnVar1->sign_nid != signid);
    bVar5 = uVar3 < 0x11;
  }
  if (pdig_nid != (int *)0x0) {
    *pdig_nid = pnVar2->digest_nid;
  }
  if (ppkey_nid != (int *)0x0) {
    *ppkey_nid = pnVar2->pkey_nid;
  }
LAB_00242e22:
  return (int)bVar5;
}

Assistant:

int OBJ_find_sigid_algs(int sign_nid, int *out_digest_nid, int *out_pkey_nid) {
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kTriples); i++) {
    if (kTriples[i].sign_nid == sign_nid) {
      if (out_digest_nid != NULL) {
        *out_digest_nid = kTriples[i].digest_nid;
      }
      if (out_pkey_nid != NULL) {
        *out_pkey_nid = kTriples[i].pkey_nid;
      }
      return 1;
    }
  }

  return 0;
}